

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

bool __thiscall DataFilters::isFiltered(DataFilters *this,DataVector *data)

{
  pointer pNVar1;
  pointer pDVar2;
  pointer pNVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  pNVar3 = (this->_numericFilters).
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (this->_numericFilters).
           super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar1 == pNVar3) {
    bVar6 = true;
  }
  else {
    pDVar2 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
             super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pDVar2 >> 4;
    bVar6 = true;
    do {
      uVar5 = (ulong)pNVar3->index;
      if (pNVar3->index < (uint)uVar4) {
        if (uVar4 <= uVar5) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        if ((pDVar2[uVar5].active == true) &&
           ((bool)(-(pDVar2[uVar5].value < (pNVar3->filter)._minValue ||
                    (pNVar3->filter)._maxValue < pDVar2[uVar5].value) & 1U) !=
            (pNVar3->filter)._isAccept)) {
          return bVar6;
        }
      }
      pNVar3 = pNVar3 + 1;
      bVar6 = pNVar3 != pNVar1;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool
    isFiltered(DataVector const & data) const
    {
        unsigned int size = data.size();
        // Iterate through and check if any filter applies to this data point
        if (this->_numericFilters.size() == 0) return true;
        for (std::vector<NumericFilterCase>::const_iterator it = this->_numericFilters.begin(); it != this->_numericFilters.end(); ++it)
        {
            if (it->index >= size || !data.at(it->index).active) continue; // don't check if out-of-range or data is not active
            if (it->filter.isFiltered(data.at(it->index).value)) return true;
        }
        return false;
    }